

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O1

void __thiscall f8n::runtime::MessageQueue::Dispatch(MessageQueue *this)

{
  size_t *psVar1;
  list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  *this_00;
  _Rb_tree_header *p_Var2;
  long lVar3;
  _Base_ptr p_Var4;
  long lVar5;
  ulong uVar6;
  _List_node_base *p_Var7;
  _Base_ptr p_Var8;
  _Rb_tree_header *p_Var9;
  bool bVar10;
  _List_node_base *p_Var11;
  _List_node_base *p_Var12;
  LockT lock;
  IMessagePtr local_58;
  list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
  *local_48;
  unique_lock<std::mutex> local_40;
  
  lVar5 = std::chrono::_V2::system_clock::now();
  lVar3 = (this->nextMessageTime).super___atomic_base<long>._M_i;
  if (-1 < lVar3 && lVar3 <= lVar5 / 1000000) {
    local_40._M_device = &this->queueMutex;
    local_40._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    LOCK();
    (this->nextMessageTime).super___atomic_base<long>._M_i = -1;
    UNLOCK();
    p_Var11 = (this->queue).
              super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var11 != (_List_node_base *)&this->queue) {
      p_Var2 = &(this->targets)._M_t._M_impl.super__Rb_tree_header;
      local_48 = &this->dispatch;
      bVar10 = false;
      do {
        p_Var12 = p_Var11[1]._M_next;
        if (lVar5 / 1000000 < (long)p_Var12[1]._M_next) {
          bVar10 = true;
          p_Var12 = p_Var11;
        }
        else {
          uVar6 = (*(code *)p_Var12->_M_next->_M_next[1]._M_next)();
          if (uVar6 == 0) {
LAB_001d1369:
            p_Var7 = (_List_node_base *)operator_new(0x18);
            p_Var7[1]._M_next = p_Var12;
            std::__detail::_List_node_base::_M_hook(p_Var7);
            psVar1 = &(this->dispatch).
                      super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
                      ._M_impl._M_node._M_size;
            *psVar1 = *psVar1 + 1;
          }
          else {
            p_Var4 = (this->targets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var8 = &p_Var2->_M_header;
            for (; (_Rb_tree_header *)p_Var4 != (_Rb_tree_header *)0x0;
                p_Var4 = (&p_Var4->_M_left)[*(ulong *)(p_Var4 + 1) < uVar6]) {
              if (*(ulong *)(p_Var4 + 1) >= uVar6) {
                p_Var8 = p_Var4;
              }
            }
            p_Var9 = p_Var2;
            if (((_Rb_tree_header *)p_Var8 != p_Var2) &&
               (p_Var9 = (_Rb_tree_header *)p_Var8,
               uVar6 < ((_Rb_tree_header *)p_Var8)->_M_node_count)) {
              p_Var9 = p_Var2;
            }
            if (p_Var9 != p_Var2) goto LAB_001d1369;
          }
          p_Var12 = p_Var11->_M_next;
          psVar1 = &(this->queue).
                    super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
                    ._M_impl._M_node._M_size;
          *psVar1 = *psVar1 - 1;
          std::__detail::_List_node_base::_M_unhook();
          operator_delete(p_Var11,0x18);
        }
      } while ((!bVar10) && (p_Var11 = p_Var12, p_Var12 != (_List_node_base *)&this->queue));
    }
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
    this_00 = &this->dispatch;
    p_Var11 = (this->dispatch).
              super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var11 != (_List_node_base *)this_00) {
      do {
        local_58.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)(p_Var11[1]._M_next)->_M_next;
        local_58.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(p_Var11[1]._M_next)->_M_prev;
        if (local_58.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_58.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_58.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_58.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_58.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        Dispatch(this,&local_58);
        if (local_58.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super___shared_ptr<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        p_Var12 = p_Var11[1]._M_next;
        if (p_Var12 != (_List_node_base *)0x0) {
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var12->_M_prev !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var12->_M_prev);
          }
          operator_delete(p_Var12,0x18);
        }
        p_Var11 = p_Var11->_M_next;
      } while (p_Var11 != (_List_node_base *)this_00);
    }
    std::__cxx11::
    list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
    ::clear(this_00);
    if ((this->queue).
        super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
        ._M_impl._M_node._M_size != 0) {
      LOCK();
      (this->nextMessageTime).super___atomic_base<long>._M_i =
           (__int_type)
           (this->queue).
           super__List_base<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ._M_impl._M_node.super__List_node_base._M_next[1]._M_next[1]._M_next;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void MessageQueue::Dispatch() {
    milliseconds now = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch());

    int64_t nextTime = nextMessageTime.load();

    if (nextTime > now.count() || nextTime < 0) {
        return; /* short circuit before any iteration. */
    }

    using Iterator = std::list<EnqueuedMessage*>::iterator;

    {
        LockT lock(this->queueMutex);

        this->nextMessageTime.store(-1);

        Iterator it = this->queue.begin();

        bool done = false;
        while (!done && it != this->queue.end()) {
            /* messages are time-ordered. pop and dispatch one at a time
            until we get to a message that should be delivered in the future,
            or the queue has been exhausted. */

            EnqueuedMessage *m = (*it);

            if (now >= m->time) {
                /* it's possible the target (receiver) has been unregistered;
                if that's the case, just discard it. otherwise, add it to the
                output set to be dispatched outside of the critical section */
                auto const target = (*it)->message->Target();
                if (target == nullptr || this->targets.find(target) != this->targets.end()) {
                    this->dispatch.push_back(m);
                }
                it = this->queue.erase(it);
            }
            else {
                done = true;
            }
        }
    }

    /* dispatch outside of the critical section */

    Iterator it = this->dispatch.begin();
    while (it != this->dispatch.end()) {
        this->Dispatch((*it)->message);
        delete *it;
        it++;
    }

    this->dispatch.clear();

    if (this->queue.size()) {
        this->nextMessageTime.store((*this->queue.begin())->time.count());
    }
}